

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::NotImplementedException::NotImplementedException
          (NotImplementedException *this,SourceLineInfo *lineInfo)

{
  pointer pcVar1;
  ostringstream local_1d0 [8];
  ostringstream oss;
  ios_base local_160 [264];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  string *local_38;
  
  *(undefined ***)this = &PTR__NotImplementedException_0017f938;
  local_38 = (string *)&this->m_what;
  (this->m_what)._M_dataplus._M_p = (pointer)&(this->m_what).field_2;
  (this->m_what)._M_string_length = 0;
  (this->m_what).field_2._M_local_buf[0] = '\0';
  (this->m_lineInfo).file._M_dataplus._M_p = (pointer)&(this->m_lineInfo).file.field_2;
  pcVar1 = (lineInfo->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_lineInfo,pcVar1,pcVar1 + (lineInfo->file)._M_string_length);
  (this->m_lineInfo).line = lineInfo->line;
  std::__cxx11::ostringstream::ostringstream(local_1d0);
  operator<<((ostream *)local_1d0,lineInfo);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,": function ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"not implemented",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=(local_38,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1d0);
  std::ios_base::~ios_base(local_160);
  return;
}

Assistant:

NotImplementedException::NotImplementedException(SourceLineInfo const& lineInfo)
		: m_lineInfo(lineInfo) {
		std::ostringstream oss;
		oss << lineInfo << ": function ";
		oss << "not implemented";
		m_what = oss.str();
	}